

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O1

uchar * CVmRun::get_named_args_from_frame(vm_val_t *fp,vm_val_t **arg0)

{
  char cVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  CVmNativeCodeDesc *pCVar3;
  size_t sVar4;
  char *pcVar5;
  uchar *puVar6;
  uint uVar7;
  vm_val_t *pvVar8;
  
  uVar7 = fp[-4].val.obj;
  aVar2 = fp[-3].val;
  pCVar3 = fp[-5].val.native_desc;
  if (pCVar3 != (CVmNativeCodeDesc *)0x0 && uVar7 == 0) {
    pcVar5 = *(char **)&pCVar3[5].opt_argc_;
    if (pcVar5 == (char *)0x0) {
      uVar7 = 0;
    }
    else {
      cVar1 = *pcVar5;
      sVar4 = CVmOpcodes::get_op_size((uchar *)(pcVar5 + (cVar1 == 'v')));
      uVar7 = ((int)sVar4 + (int)(pcVar5 + (cVar1 == 'v'))) - aVar2.obj;
    }
  }
  puVar6 = (uchar *)0x0;
  if ((aVar2.ptr != (void *)0x0) && (uVar7 != 0)) {
    pcVar5 = (char *)((ulong)uVar7 + (long)aVar2.ptr);
    if (*(char *)((long)aVar2.ptr + (ulong)uVar7) == 'V') {
      pcVar5 = pcVar5 + (ulong)*(ushort *)(pcVar5 + 2) + 2;
    }
    if (*pcVar5 == 'W') {
      if (pCVar3 == (CVmNativeCodeDesc *)0x0) {
        pvVar8 = fp + (-0xc - (long)fp[-2].val.intval);
      }
      else {
        pvVar8 = (vm_val_t *)(*(long *)pCVar3 + (long)pCVar3->varargs_ * -0x10);
      }
      *arg0 = pvVar8;
      puVar6 = (uchar *)(pcVar5 + 3);
      *arg0 = pvVar8 + (1 - (ulong)*(ushort *)(pcVar5 + 3));
    }
    else {
      puVar6 = (uchar *)0x0;
    }
  }
  return puVar6;
}

Assistant:

const uchar *CVmRun::get_named_args_from_frame(
    VMG_ vm_val_t *fp, vm_val_t **arg0)
{
    /* get the return address */
    pool_ofs_t ofs = G_interpreter->get_return_ofs_from_frame(vmg_ fp);
    const uchar *ep =
        G_interpreter->get_enclosing_entry_ptr_from_frame(vmg_ fp);
    const vm_rcdesc *rc = G_interpreter->get_rcdesc_from_frame(vmg_ fp);

    /* check for a recursive native code caller */
    if (ofs == 0 && rc != 0 && rc->has_return_addr())
    {
        /* get the return address from the descriptor */
        ofs = rc->get_return_addr() - ep;
    }

    /* if there's no return address, there's no table */
    if (ep == 0 || ofs == 0)
        return 0;

    /* get the return instruction pointer */
    const uchar *ip = ep + ofs;
    
    /* if it's a NamedArgPtr instruction, follows the pointer */
    if (*ip == OPC_NAMEDARGPTR)
        ip += 2 + osrp2(ip+2);

    /* make sure we're at a NamedArgTab instruction */
    if (*ip == OPC_NAMEDARGTAB)
    {
        /* 
         *   We have a named argument table.  Fill in *arg0 with a pointer to
         *   the first named argument value in the stack frame.
         *   
         *   If there's a native caller at this level, get the arguments to
         *   the native caller instead of the arguments to the bytecode
         *   callee.  Native callers never send named arguments, so we can
         *   ignore the callee's arguments and look only at the native
         *   caller's arguments.  
         */
        int argc;
        if (rc != 0)
        {
            /* native caller - get the native code's arguments */
            argc = rc->argc;
            *arg0 = rc->argp - argc;
        }
        else
        {
            /* bytecode caller - get the current level's arguments */
            argc = G_interpreter->get_argc_from_frame(vmg_ fp);
            *arg0 = G_interpreter->get_param_from_frame(vmg_ fp, argc);
        }

        /* skip the NamedArgTab opcode and table length prefix */
        ip += 1 + 2;

        /* 
         *   Adjust arg0 for the number of arguments.  The compiler generates
         *   the names in the same order as the pushes, so the first name is
         *   the first value pushed. 
         */
        *arg0 -= (osrp2(ip) - 1);

        /* 
         *   return the table pointer - it starts after the NamedArgTab
         *   instruction and table byte length prefix 
         */
        return ip;
    }
    
    /* there's no named argument table in this return frame */
    return 0;
}